

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool set_ini_path(OpenJTalk *oj,char *dir)

{
  char *__src;
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char temp [260];
  char acStack_128 [264];
  
  if (((dir == (char *)0x0) || (sVar2 = strlen(dir), __src = G_INI_NAME, sVar2 == 0)) ||
     (sVar3 = strlen(G_INI_NAME), (sVar3 + sVar2) - 0x103 < 0xfffffffffffffefb)) {
    return false;
  }
  memset(acStack_128,0,0x104);
  strcpy(acStack_128,dir);
  strcat(acStack_128,G_SLASH_CHAR);
  strcat(acStack_128,__src);
  _Var1 = exists_file(acStack_128);
  if (!_Var1) {
    return _Var1;
  }
  strcpy(g_ini_path,acStack_128);
  strcpy(g_ini_dir,dir);
  if (g_verbose != true) {
    return _Var1;
  }
  console_message_string(anon_var_dwarf_872,g_ini_path);
  return _Var1;
}

Assistant:

bool set_ini_path(OpenJTalk *oj, const char *dir)
{
	if (dir == NULL || strlen(dir) == 0)
	{
		return false;
	}

	if (strlen(dir) + 1 + strlen(G_INI_NAME) + 1 > MAX_PATH)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);
	strcpy(temp, dir);
	strcat(temp, G_SLASH_CHAR);
	strcat(temp, G_INI_NAME);

	if (!exists_file(temp))
	{
		return false;
	}

	strcpy(g_ini_path, temp);
	strcpy(g_ini_dir, dir);

	if (g_verbose)
	{
		console_message_string(u8"設定ファイル： %s\n", g_ini_path);
	}
	return true;
}